

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmpfld_s.c
# Opt level: O1

errno_t strcmpfld_s(char *dest,rsize_t dmax,char *src,int *indicator)

{
  char *pcVar1;
  long lVar2;
  errno_t error;
  char *pcVar3;
  errno_t eVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (indicator == (int *)0x0) {
    pcVar5 = "strcmpfld_s: indicator is null";
LAB_00104b34:
    eVar4 = 400;
    error = 400;
  }
  else {
    *indicator = 0;
    if (dest == (char *)0x0) {
      pcVar5 = "strcmpfld_s: dest is null";
      goto LAB_00104b34;
    }
    if (src == (char *)0x0) {
      pcVar5 = "strcmpfld_s: src is null";
      goto LAB_00104b34;
    }
    if (dmax == 0) {
      pcVar5 = "strcmpfld_s: dmax is 0";
      eVar4 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        pcVar5 = dest + dmax;
        pcVar1 = src + dmax;
        do {
          pcVar3 = src;
          pcVar6 = dest;
          if (*dest != *src) break;
          dest = dest + 1;
          src = src + 1;
          dmax = dmax - 1;
          pcVar3 = pcVar1;
          pcVar6 = pcVar5;
        } while (dmax != 0);
        *indicator = (int)*pcVar6 - (int)*pcVar3;
        eVar4 = 0;
        goto LAB_00104b45;
      }
      pcVar5 = "strcmpfld_s: dmax exceeds max";
      eVar4 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(pcVar5,(void *)0x0,error);
LAB_00104b45:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return eVar4;
}

Assistant:

errno_t
strcmpfld_s (const char *dest, rsize_t dmax,
             const char *src, int *indicator)
{
    if (indicator == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: indicator is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *indicator = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* compare for dmax charactrers, not the null! */
    while (dmax) {

        if (*dest != *src) {
            break;
        }

        dest++;
        src++;
        dmax--;
    }

    *indicator = *dest - *src;
    return (EOK);
}